

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::TestSpecParser::addPattern<Catch::TestSpec::TagPattern>(TestSpecParser *this)

{
  int iVar1;
  long *plVar2;
  pointer puVar3;
  Pattern *pPVar4;
  pointer puVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  Ptr<Catch::TestSpec::Pattern> pattern;
  string token;
  NonCopyable local_b0;
  ulong local_a8;
  Pattern local_a0;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  string local_70;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  std::__cxx11::string::substr((ulong)&local_70,(ulong)&this->m_arg);
  puVar3 = (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar5 = (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 != puVar3) {
    uVar6 = 0;
    do {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_70);
      std::__cxx11::string::substr((ulong)&local_90,(ulong)&local_70);
      uVar7 = 0xf;
      if (local_50 != local_40) {
        uVar7 = local_40[0];
      }
      if (uVar7 < (ulong)(local_88 + local_48)) {
        uVar7 = 0xf;
        if (local_90 != local_80) {
          uVar7 = local_80[0];
        }
        if (uVar7 < (ulong)(local_88 + local_48)) goto LAB_0012670a;
        plVar2 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_90,0,(char *)0x0,(ulong)local_50);
      }
      else {
LAB_0012670a:
        plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_90);
      }
      pPVar4 = (Pattern *)(plVar2 + 2);
      if ((Pattern *)*plVar2 == pPVar4) {
        local_a0.super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable
             = (NonCopyable)
               (pPVar4->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
               _vptr_NonCopyable;
        local_a0.super_SharedImpl<Catch::IShared>._8_8_ = plVar2[3];
        local_b0._vptr_NonCopyable = (_func_int **)&local_a0;
      }
      else {
        local_a0.super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable
             = (NonCopyable)
               (pPVar4->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
               _vptr_NonCopyable;
        local_b0._vptr_NonCopyable = (_func_int **)*plVar2;
      }
      local_a8 = plVar2[1];
      *plVar2 = (long)pPVar4;
      plVar2[1] = 0;
      *(undefined1 *)
       &(pPVar4->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
           = 0;
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_b0);
      if ((Pattern *)local_b0._vptr_NonCopyable != &local_a0) {
        operator_delete(local_b0._vptr_NonCopyable);
      }
      if (local_90 != local_80) {
        operator_delete(local_90);
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      uVar6 = uVar6 + 1;
      puVar3 = (this->m_escapeChars).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar5 = (this->m_escapeChars).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (uVar6 < (ulong)((long)puVar5 - (long)puVar3 >> 3));
  }
  if (puVar5 != puVar3) {
    (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  local_b0._vptr_NonCopyable = (_func_int **)&local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"exclude:","");
  if (local_70._M_string_length < local_a8) {
    bVar8 = false;
  }
  else if (local_a8 == 0) {
    bVar8 = true;
  }
  else {
    iVar1 = bcmp(local_b0._vptr_NonCopyable,local_70._M_dataplus._M_p,local_a8);
    bVar8 = iVar1 == 0;
  }
  if ((Pattern *)local_b0._vptr_NonCopyable != &local_a0) {
    operator_delete(local_b0._vptr_NonCopyable);
  }
  if (bVar8) {
    this->m_exclusion = true;
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)&local_70);
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_b0);
    if ((Pattern *)local_b0._vptr_NonCopyable != &local_a0) {
      operator_delete(local_b0._vptr_NonCopyable);
    }
  }
  if (local_70._M_string_length != 0) {
    pPVar4 = (Pattern *)operator_new(0x30);
    (pPVar4->super_SharedImpl<Catch::IShared>).m_rc = 0;
    (pPVar4->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable =
         (_func_int **)&PTR__TagPattern_00161890;
    toLower((string *)(pPVar4 + 1),&local_70);
    local_b0._vptr_NonCopyable = (_func_int **)pPVar4;
    (*(pPVar4->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
      [2])(pPVar4);
    if (this->m_exclusion == true) {
      pPVar4 = (Pattern *)operator_new(0x18);
      (pPVar4->super_SharedImpl<Catch::IShared>).m_rc = 0;
      (pPVar4->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable =
           (_func_int **)&PTR__ExcludedPattern_001618c8;
      pPVar4[1].super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable =
           local_b0._vptr_NonCopyable;
      if ((Pattern *)local_b0._vptr_NonCopyable != (Pattern *)0x0) {
        (**(code **)(*local_b0._vptr_NonCopyable + 0x10))();
      }
      Ptr<Catch::TestSpec::Pattern>::operator=((Ptr<Catch::TestSpec::Pattern> *)&local_b0,pPVar4);
    }
    std::
    vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ::push_back(&(this->m_currentFilter).m_patterns,(value_type *)&local_b0);
    if ((Pattern *)local_b0._vptr_NonCopyable != (Pattern *)0x0) {
      (**(code **)(*local_b0._vptr_NonCopyable + 0x18))();
    }
  }
  this->m_exclusion = false;
  this->m_mode = None;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void addPattern() {
            std::string token = subString();
            for( size_t i = 0; i < m_escapeChars.size(); ++i )
                token = token.substr( 0, m_escapeChars[i]-m_start-i ) + token.substr( m_escapeChars[i]-m_start-i+1 );
            m_escapeChars.clear();
            if( startsWith( token, "exclude:" ) ) {
                m_exclusion = true;
                token = token.substr( 8 );
            }
            if( !token.empty() ) {
                Ptr<TestSpec::Pattern> pattern = new T( token );
                if( m_exclusion )
                    pattern = new TestSpec::ExcludedPattern( pattern );
                m_currentFilter.m_patterns.push_back( pattern );
            }
            m_exclusion = false;
            m_mode = None;
        }